

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::argument_incorrect_type::argument_incorrect_type(argument_incorrect_type *this,string *arg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"Argument ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::LQUOTE_abi_cxx11_);
  std::operator+(&bStack_98,&local_38,arg);
  std::operator+(&local_78,&bStack_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::RQUOTE_abi_cxx11_);
  std::operator+(&local_58,&local_78," failed to parse");
  OptionParseException::OptionParseException(&this->super_OptionParseException,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&(this->super_OptionParseException).super_OptionException =
       &PTR__OptionException_0013d998;
  return;
}

Assistant:

argument_incorrect_type
    (
      const std::string& arg
    )
    : OptionParseException(
        "Argument " + LQUOTE + arg + RQUOTE + " failed to parse"
      )
    {
    }